

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralItem::~IfcStructuralItem(IfcStructuralItem *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x815d18;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x815d90;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x815d40;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x815d68;
  puVar2 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x815e30;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x815e58;
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x128);
  return;
}

Assistant:

IfcStructuralItem() : Object("IfcStructuralItem") {}